

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O0

int __thiscall Fossilize::CLIParser::next_sint(CLIParser *this)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  allocator local_39;
  string local_38;
  long local_18;
  long val;
  CLIParser *this_local;
  
  val = (long)this;
  if (this->argc == 0) {
    fprintf(_stderr,"Fossilize ERROR: Tried to parse sint, but nothing left in arguments.\n");
    fflush(_stderr);
    exit(1);
  }
  pcVar1 = *this->argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  lVar4 = std::__cxx11::stol(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = lVar4;
  iVar3 = std::numeric_limits<int>::max();
  lVar2 = local_18;
  if (lVar4 <= iVar3) {
    iVar3 = std::numeric_limits<int>::min();
    if (iVar3 <= lVar2) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (int)local_18;
    }
  }
  fprintf(_stderr,"Fossilize ERROR: next_sint() out of range.\n");
  fflush(_stderr);
  exit(1);
}

Assistant:

int CLIParser::next_sint()
{
	if (!argc)
	{
		LOGE("Tried to parse sint, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	auto val = stol(*argv);
	if (val > numeric_limits<int>::max() || val < numeric_limits<int>::min())
	{
		LOGE("next_sint() out of range.\n");
		exit(EXIT_FAILURE);
	}

	argc--;
	argv++;

	return int(val);
}